

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

void __thiscall
markdown::token::BoldOrItalicMarker::writeAsHtml(BoldOrItalicMarker *this,ostream *out)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (this->mDisabled == false) {
    if (this->mMatch != (BoldOrItalicMarker *)0x0) {
      sVar1 = this->mSize;
      if (sVar1 - 1 < 3) {
        if (this->mOpenMarker == true) {
          pcVar3 = "<strong><em>";
          if (sVar1 == 2) {
            pcVar3 = "<strong>";
          }
          __s = "<em>";
        }
        else {
          pcVar3 = "</em></strong>";
          if (sVar1 == 2) {
            pcVar3 = "</strong>";
          }
          __s = "</em>";
        }
        if (sVar1 != 1) {
          __s = pcVar3;
        }
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
        return;
      }
      __assert_fail("mSize>=1 && mSize<=3",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                    ,0x2e4,
                    "virtual void markdown::token::BoldOrItalicMarker::writeAsHtml(std::ostream &) const"
                   );
    }
    local_38 = local_28;
    std::__cxx11::string::_M_construct((ulong)&local_38,(char)this->mSize);
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_38,local_30);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void BoldOrItalicMarker::writeAsHtml(std::ostream& out) const {
	if (!mDisabled) {
		if (mMatch!=0) {
			assert(mSize>=1 && mSize<=3);
			if (mOpenMarker) {
				out << (mSize==1 ? "<em>" : mSize==2 ? "<strong>" : "<strong><em>");
			} else {
				out << (mSize==1 ? "</em>" : mSize==2 ? "</strong>" : "</em></strong>");
			}
		} else out << std::string(mSize, mTokenCharacter);
	}
}